

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TimingOf<std::chrono::_V2::steady_clock,_Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_>,_run_for_at_least_argument_t<steady_clock,_repeater<now<steady_clock>_>_>_>
 Catch::Benchmark::Detail::
 run_for_at_least<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>>>
           (ClockDuration<std::chrono::_V2::steady_clock> how_long,int seed,
           repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_> *fun)

{
  TimingOf<std::chrono::_V2::steady_clock,_Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_>,_run_for_at_least_argument_t<steady_clock,_repeater<now<steady_clock>_>_>_>
  TVar1;
  bool bVar2;
  optimized_away_error local_60 [2];
  TimingOf<std::chrono::_V2::steady_clock,_Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_>_&,_int>
  local_50;
  TimingOf<std::chrono::_V2::steady_clock,_Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_>_&,_int>
  *local_40;
  TimingOf<std::chrono::_V2::steady_clock,_Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_>_&,_int>
  *Timing;
  repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_> *prStack_30;
  int iters;
  repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_> *fun_local;
  ClockDuration<std::chrono::_V2::steady_clock> CStack_20;
  int seed_local;
  ClockDuration<std::chrono::_V2::steady_clock> how_long_local;
  undefined4 local_10;
  
  Timing._4_4_ = seed;
  prStack_30 = fun;
  fun_local._4_4_ = seed;
  CStack_20.__r = how_long.__r;
  while( true ) {
    if (0x3fffffff < Timing._4_4_) {
      local_60[0] = (optimized_away_error)0x0;
      optimized_away_error::optimized_away_error(local_60);
      throw_exception<Catch::Benchmark::Detail::optimized_away_error>(local_60);
    }
    local_50 = measure_one<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>>&>
                         (prStack_30,Timing._4_4_);
    local_40 = &local_50;
    bVar2 = std::chrono::operator>=(&local_40->elapsed,&stack0xffffffffffffffe0);
    if (bVar2) break;
    Timing._4_4_ = Timing._4_4_ << 1;
  }
  TVar1._8_4_ = local_10;
  TVar1.elapsed.__r = (local_40->elapsed).__r;
  TVar1.iterations = Timing._4_4_;
  return TVar1;
}

Assistant:

TimingOf<Clock, Fun, run_for_at_least_argument_t<Clock, Fun>> run_for_at_least(ClockDuration<Clock> how_long, int seed, Fun&& fun) {
                auto iters = seed;
                while (iters < (1 << 30)) {
                    auto&& Timing = measure_one<Clock>(fun, iters, is_callable<Fun(Chronometer)>());

                    if (Timing.elapsed >= how_long) {
                        return { Timing.elapsed, std::move(Timing.result), iters };
                    }
                    iters *= 2;
                }
                Catch::throw_exception(optimized_away_error{});
            }